

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLElement::Attribute(XMLElement *this,char *name,char *value)

{
  XMLAttribute *pXVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  
  pXVar1 = FindAttribute(this,name);
  if (pXVar1 == (XMLAttribute *)0x0) {
    return (char *)0x0;
  }
  if ((value != (char *)0x0) && (pcVar2 = StrPair::GetStr(&pXVar1->_value), pcVar2 != value)) {
    cVar4 = *pcVar2;
    if (cVar4 != '\0') {
      lVar3 = 0;
      do {
        if ((cVar4 != value[lVar3]) || ((int)lVar3 == 0x7fffffff)) {
          if ((int)lVar3 != 0x7fffffff) {
            return (char *)0x0;
          }
          goto LAB_00177a5b;
        }
        cVar4 = pcVar2[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar4 != '\0');
      if ((int)lVar3 == 0x7fffffff) goto LAB_00177a5b;
      value = value + lVar3;
    }
    if (*value != '\0') {
      return (char *)0x0;
    }
  }
LAB_00177a5b:
  pcVar2 = StrPair::GetStr(&pXVar1->_value);
  return pcVar2;
}

Assistant:

const char* XMLElement::Attribute( const char* name, const char* value ) const
{
    const XMLAttribute* a = FindAttribute( name );
    if ( !a ) {
        return 0;
    }
    if ( !value || XMLUtil::StringEqual( a->Value(), value )) {
        return a->Value();
    }
    return 0;
}